

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void * map_remove(Map *map,void *key)

{
  List *list;
  bool bVar1;
  uint index;
  long *unaff_R12;
  void *pvVar2;
  
  pvVar2 = (void *)0x0;
  list = (List *)map->elem[(ulong)key % (ulong)map->prime];
  if (list != (List *)0x0) {
    if (list->size == 0) {
      bVar1 = true;
    }
    else {
      index = 0;
      do {
        unaff_R12 = (long *)list_get(list,index);
        bVar1 = unaff_R12 != (long *)0x0;
        if (unaff_R12 == (long *)0x0) {
          unaff_R12 = (long *)0x0;
          break;
        }
        if ((void *)*unaff_R12 == key) {
          list_remove(list,index);
          bVar1 = true;
          break;
        }
        index = index + 1;
      } while (index < list->size);
    }
    if (bVar1) {
      pvVar2 = (void *)unaff_R12[1];
      free(unaff_R12);
      map->size = map->size - 1;
    }
    else {
      pvVar2 = (void *)0x0;
    }
  }
  return pvVar2;
}

Assistant:

void *map_remove(Map *map, void *key) {
    List *els = map_get_(map, key);
    if (els == NULL)return NULL;
    Elem *elem;
    for (int i = 0; i < els->size; ++i) {
        elem = list_get(els, i);
        if (elem == NULL)return NULL;
        if (hash(elem->key) == hash(key)) {
            list_remove(els, i);
            break;
        }
    }
    void *value = elem->value;
    free(elem);
    map->size--;
    return value;
}